

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void Eigen::internal::
     conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
     ::run(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *_this,Index rows,Index cols)

{
  Index IVar1;
  DenseStorage<double,__1,__1,__1,_0> *this;
  long *plVar2;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this_00;
  bool local_119;
  BlockXpr local_118;
  BlockXpr local_e0;
  Index local_a8;
  Index local_a0;
  Index common_cols;
  Index local_88;
  long local_80;
  Index common_rows;
  PlainObject tmp;
  Index cols_local;
  Index rows_local;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *_this_local;
  undefined8 uStack_40;
  bool error;
  long max_index;
  Index local_30;
  long *local_28;
  Index *local_20;
  long *local_18;
  long *local_10;
  
  tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = cols;
  cols_local = rows;
  rows_local = (Index)_this;
  IVar1 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)_this);
  if ((IVar1 != cols_local) ||
     (IVar1 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                        ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)rows_local),
     IVar1 != tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
     ) {
    IVar1 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)rows_local);
    if (IVar1 == cols_local) {
      local_30 = cols_local;
      max_index = tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols;
      uStack_40 = 0x7fffffffffffffff;
      if ((cols_local == 0) ||
         (tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols == 0
         )) {
        local_119 = false;
      }
      else {
        local_119 = 0x7fffffffffffffff /
                    tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_cols < cols_local;
      }
      _this_local._7_1_ = local_119;
      if (local_119 != false) {
        throw_std_bad_alloc();
      }
      this = (DenseStorage<double,__1,__1,__1,_0> *)
             EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::derived
                       ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)rows_local);
      DenseStorage<double,_-1,_-1,_-1,_0>::conservativeResize
                (this,cols_local *
                      tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                      .m_cols,cols_local,
                 tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_cols);
    }
    else {
      Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
                ((Matrix<double,_1,_1,0,_1,_1> *)&common_rows,&cols_local,
                 &tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols);
      local_88 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                           ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)rows_local);
      local_10 = &cols_local;
      local_18 = &local_88;
      plVar2 = std::min<long>(local_10,local_18);
      local_80 = *plVar2;
      local_a8 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                           ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)rows_local);
      local_20 = &tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols;
      local_28 = &local_a8;
      plVar2 = std::min<long>(local_20,local_28);
      local_a0 = *plVar2;
      DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::block
                (&local_e0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)rows_local,0,0,
                 local_80,local_a0);
      DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::block
                (&local_118,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&common_rows,0,0
                 ,local_80,local_a0);
      Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::operator=
                (&local_118,&local_e0);
      this_00 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::derived
                          ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)rows_local);
      PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      swap<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                (this_00,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&common_rows);
      Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)&common_rows);
    }
  }
  return;
}

Assistant:

static void run(DenseBase<Derived>& _this, Index rows, Index cols)
  {
    if (_this.rows() == rows && _this.cols() == cols) return;
    EIGEN_STATIC_ASSERT_DYNAMIC_SIZE(Derived)

    if ( ( Derived::IsRowMajor && _this.cols() == cols) || // row-major and we change only the number of rows
         (!Derived::IsRowMajor && _this.rows() == rows) )  // column-major and we change only the number of columns
    {
      internal::check_rows_cols_for_overflow<Derived::MaxSizeAtCompileTime>::run(rows, cols);
      _this.derived().m_storage.conservativeResize(rows*cols,rows,cols);
    }
    else
    {
      // The storage order does not allow us to use reallocation.
      typename Derived::PlainObject tmp(rows,cols);
      const Index common_rows = numext::mini(rows, _this.rows());
      const Index common_cols = numext::mini(cols, _this.cols());
      tmp.block(0,0,common_rows,common_cols) = _this.block(0,0,common_rows,common_cols);
      _this.derived().swap(tmp);
    }
  }